

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall mkvparser::Block::Parse(Block *this,Cluster *pCluster)

{
  IMkvReader *pReader;
  byte bVar1;
  longlong *plVar2;
  int iVar3;
  int iVar4;
  longlong lVar5;
  long lVar6;
  Frame *pFVar7;
  ulong uVar8;
  uint uVar9;
  Frame *curr;
  long lVar10;
  Frame *pFVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  byte bVar16;
  bool bVar17;
  Frame *f;
  uchar val;
  uchar biased_count;
  long len;
  longlong value;
  ulong local_70;
  byte local_62;
  byte local_61;
  Frame *local_60;
  long local_58;
  long local_50;
  IMkvReader *local_48;
  long local_40;
  long local_38;
  
  if (pCluster == (Cluster *)0x0) {
    return -1;
  }
  if (pCluster->m_pSegment == (Segment *)0x0) {
    return -1;
  }
  lVar12 = this->m_start;
  lVar15 = this->m_size;
  pReader = pCluster->m_pSegment->m_pReader;
  lVar5 = ReadUInt(pReader,lVar12,&local_50);
  lVar10 = local_50;
  this->m_track = lVar5;
  if (lVar5 < 1) {
    return -2;
  }
  if (lVar15 - local_50 < 2 || lVar15 < local_50) {
    return -2;
  }
  lVar14 = lVar12 + local_50;
  lVar6 = UnserializeInt(pReader,lVar14,2,&local_38);
  if (lVar6 != 0) {
    return -2;
  }
  if ((short)local_38 != local_38) {
    return -2;
  }
  lVar12 = lVar12 + lVar15;
  this->m_timecode = (short)local_38;
  if (lVar12 <= lVar14 + 2) {
    return -2;
  }
  local_48 = pReader;
  iVar3 = (**pReader->_vptr_IMkvReader)(pReader,lVar14 + 2,1,&this->m_flags);
  if (iVar3 != 0) {
    return -2;
  }
  bVar1 = this->m_flags >> 1;
  lVar6 = lVar14 + 3;
  bVar16 = bVar1 & 3;
  if ((bVar1 & 3) == 0) {
    if (lVar12 < lVar6) {
      return -2;
    }
    this->m_frame_count = 1;
    pFVar7 = (Frame *)operator_new__(0x10,(nothrow_t *)&std::nothrow);
    this->m_frames = pFVar7;
    if (pFVar7 != (Frame *)0x0) {
      pFVar7->pos = lVar6;
      if (lVar12 - lVar6 != 0 && lVar6 <= lVar12) {
        pFVar7->len = lVar12 - lVar6;
        return 0;
      }
      return -2;
    }
  }
  else {
    if (lVar12 <= lVar6) {
      return -2;
    }
    iVar3 = (**pReader->_vptr_IMkvReader)(pReader,lVar6,1,&local_61);
    if (iVar3 != 0) {
      return -2;
    }
    local_58 = lVar14 + 4;
    if (lVar12 < local_58) {
      return -2;
    }
    uVar13 = (uint)local_61;
    uVar9 = local_61 + 1;
    this->m_frame_count = uVar9;
    local_60 = (Frame *)(ulong)(uVar9 * 0x10);
    pFVar7 = (Frame *)operator_new__((ulong)local_60,(nothrow_t *)&std::nothrow);
    this->m_frames = pFVar7;
    if (pFVar7 != (Frame *)0x0) {
      if (bVar16 == 2) {
        lVar6 = lVar12 - local_58;
        if (lVar6 == 0 || lVar12 < local_58) {
          return -2;
        }
        lVar14 = lVar6 / (long)(ulong)uVar9;
        if (lVar6 % (long)(ulong)uVar9 != 0) {
          return -2;
        }
        if (lVar14 < 1) {
          return -2;
        }
        plVar2 = &pFVar7->pos;
        lVar15 = (lVar10 - lVar15) + 4;
        do {
          if (lVar12 < local_58 + lVar14) {
            return -2;
          }
          pFVar7->pos = local_58;
          pFVar7->len = lVar14;
          pFVar7 = pFVar7 + 1;
          lVar15 = lVar15 + lVar14;
          local_58 = local_58 + lVar14;
        } while (pFVar7 != (Frame *)((long)plVar2 + (ulong)(uVar9 * 0x10)));
        bVar17 = lVar15 == 0;
      }
      else {
        if (bVar16 != 1) {
          if (lVar12 <= local_58) {
            return -2;
          }
          uVar8 = ReadUInt(local_48,local_58,&local_50);
          if ((long)uVar8 < 1) {
            return -2;
          }
          lVar15 = local_58 + local_50;
          if (lVar12 < (long)(lVar15 + uVar8) || lVar12 < lVar15) {
            return -2;
          }
          pFVar7 = this->m_frames;
          iVar3 = this->m_frame_count;
          local_60 = pFVar7 + iVar3;
          pFVar7->pos = 0;
          pFVar7->len = uVar8;
          lVar10 = (long)iVar3 * 0x10 + -0x20;
          local_70 = uVar8;
          do {
            pFVar11 = pFVar7 + 1;
            if ((int)uVar13 < 2) {
              if (uVar13 == 1) {
                lVar6 = lVar12 - lVar15;
                if (lVar12 < lVar15) {
                  return -2;
                }
                if (local_60 <= pFVar7) {
                  return -2;
                }
                if (pFVar7->len != local_70) {
                  return -2;
                }
                if (local_60 <= pFVar11) {
                  return -2;
                }
                if (lVar10 != 0) {
                  return -2;
                }
                pFVar11->pos = 0;
                if (lVar6 < (long)uVar8) {
                  return -2;
                }
                if (lVar6 - uVar8 == 0 || lVar6 < (long)uVar8) {
                  return -2;
                }
                pFVar7[1].len = lVar6 - uVar8;
              }
              pFVar7 = this->m_frames;
              while (pFVar7 != local_60) {
                lVar10 = pFVar7->len + lVar15;
                if (lVar10 <= lVar12) {
                  pFVar7->pos = lVar15;
                  lVar15 = lVar10;
                }
                pFVar7 = pFVar7 + 1;
                if (lVar12 < lVar10) {
                  return -2;
                }
              }
              bVar17 = lVar15 == lVar12;
              goto LAB_0015f1c6;
            }
            if (lVar12 <= lVar15) {
              return -2;
            }
            if (local_60 <= pFVar7) {
              return -2;
            }
            if (pFVar11 < local_60 && pFVar7->len == local_70) {
              pFVar11->pos = 0;
              lVar5 = ReadUInt(local_48,lVar15,&local_50);
              if ((lVar5 < 0) || (lVar6 = local_50 + lVar15, lVar12 < lVar6)) goto LAB_0015f039;
              local_70 = local_70 + lVar5 + (-1L << ((char)local_50 * '\a' - 1U & 0x3f)) + 1;
              if (((long)local_70 < 1) ||
                 (pFVar7[1].len = local_70, (long)(local_70 ^ 0x7fffffffffffffff) < (long)uVar8)) {
                bVar17 = false;
              }
              else {
                uVar8 = uVar8 + local_70;
                uVar13 = uVar13 - 1;
                bVar17 = true;
              }
            }
            else {
LAB_0015f039:
              bVar17 = false;
              lVar6 = lVar15;
            }
            lVar10 = lVar10 + -0x10;
            lVar15 = lVar6;
            pFVar7 = pFVar11;
            if (!bVar17) {
              return -2;
            }
          } while( true );
        }
        local_60 = (Frame *)((long)&pFVar7->pos + (long)local_60);
        local_40 = 0;
        lVar15 = local_58;
        while (1 < (int)uVar9) {
          lVar10 = 0;
          do {
            iVar3 = 1;
            if ((lVar15 < lVar12) &&
               (iVar4 = (**pReader->_vptr_IMkvReader)(pReader,lVar15,1), iVar4 == 0)) {
              lVar15 = lVar15 + 1;
              lVar10 = lVar10 + (ulong)local_62;
              iVar3 = (uint)((ulong)local_62 != 0xff) << 2;
            }
          } while (iVar3 == 0);
          if (iVar3 == 4) {
            pFVar11 = pFVar7 + 1;
            if ((pFVar11 < local_60) && (pFVar7->pos = 0, 0 < lVar10)) {
              pFVar7->len = lVar10;
              local_40 = local_40 + lVar10;
              uVar9 = uVar9 - 1;
              bVar17 = true;
              pFVar7 = pFVar11;
            }
            else {
              bVar17 = false;
              pFVar7 = pFVar11;
            }
          }
          else {
            bVar17 = false;
          }
          if (!bVar17) {
            return -2;
          }
        }
        lVar10 = lVar12 - lVar15;
        if (pFVar7 + 1 != local_60 || (lVar12 < lVar15 || local_60 <= pFVar7)) {
          return -2;
        }
        pFVar7->pos = 0;
        if (lVar10 < local_40) {
          return -2;
        }
        if (lVar10 - local_40 == 0 || lVar10 < local_40) {
          return -2;
        }
        pFVar7->len = lVar10 - local_40;
        pFVar7 = this->m_frames;
        while (pFVar7 != local_60) {
          lVar10 = pFVar7->len + lVar15;
          if (lVar10 <= lVar12) {
            pFVar7->pos = lVar15;
            lVar15 = lVar10;
          }
          pFVar7 = pFVar7 + 1;
          if (lVar12 < lVar10) {
            return -2;
          }
        }
        bVar17 = lVar15 == lVar12;
      }
LAB_0015f1c6:
      if (bVar17) {
        return 0;
      }
      return -2;
    }
  }
  return -1;
}

Assistant:

long Block::Parse(const Cluster* pCluster) {
  if (pCluster == NULL)
    return -1;

  if (pCluster->m_pSegment == NULL)
    return -1;

  assert(m_start >= 0);
  assert(m_size >= 0);
  assert(m_track <= 0);
  assert(m_frames == NULL);
  assert(m_frame_count <= 0);

  long long pos = m_start;
  const long long stop = m_start + m_size;

  long len;

  IMkvReader* const pReader = pCluster->m_pSegment->m_pReader;

  m_track = ReadUInt(pReader, pos, len);

  if (m_track <= 0)
    return E_FILE_FORMAT_INVALID;

  if ((pos + len) > stop)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume track number

  if ((stop - pos) < 2)
    return E_FILE_FORMAT_INVALID;

  long status;
  long long value;

  status = UnserializeInt(pReader, pos, 2, value);

  if (status)
    return E_FILE_FORMAT_INVALID;

  if (value < SHRT_MIN)
    return E_FILE_FORMAT_INVALID;

  if (value > SHRT_MAX)
    return E_FILE_FORMAT_INVALID;

  m_timecode = static_cast<short>(value);

  pos += 2;

  if ((stop - pos) <= 0)
    return E_FILE_FORMAT_INVALID;

  status = pReader->Read(pos, 1, &m_flags);

  if (status)
    return E_FILE_FORMAT_INVALID;

  const int lacing = int(m_flags & 0x06) >> 1;

  ++pos;  // consume flags byte

  if (lacing == 0) {  // no lacing
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;

    m_frame_count = 1;
    m_frames = new (std::nothrow) Frame[m_frame_count];
    if (m_frames == NULL)
      return -1;

    Frame& f = m_frames[0];
    f.pos = pos;

    const long long frame_size = stop - pos;

    if (frame_size > LONG_MAX || frame_size <= 0)
      return E_FILE_FORMAT_INVALID;

    f.len = static_cast<long>(frame_size);

    return 0;  // success
  }

  if (pos >= stop)
    return E_FILE_FORMAT_INVALID;

  unsigned char biased_count;

  status = pReader->Read(pos, 1, &biased_count);

  if (status)
    return E_FILE_FORMAT_INVALID;

  ++pos;  // consume frame count
  if (pos > stop)
    return E_FILE_FORMAT_INVALID;

  m_frame_count = int(biased_count) + 1;

  m_frames = new (std::nothrow) Frame[m_frame_count];
  if (m_frames == NULL)
    return -1;

  if (!m_frames)
    return E_FILE_FORMAT_INVALID;

  if (lacing == 1) {  // Xiph
    Frame* pf = m_frames;
    Frame* const pf_end = pf + m_frame_count;

    long long size = 0;
    int frame_count = m_frame_count;

    while (frame_count > 1) {
      long frame_size = 0;

      for (;;) {
        unsigned char val;

        if (pos >= stop)
          return E_FILE_FORMAT_INVALID;

        status = pReader->Read(pos, 1, &val);

        if (status)
          return E_FILE_FORMAT_INVALID;

        ++pos;  // consume xiph size byte

        frame_size += val;

        if (val < 255)
          break;
      }

      Frame& f = *pf++;
      assert(pf < pf_end);
      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      f.pos = 0;  // patch later

      if (frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      f.len = frame_size;
      size += frame_size;  // contribution of this frame

      --frame_count;
    }

    if (pf >= pf_end || pos > stop)
      return E_FILE_FORMAT_INVALID;

    {
      Frame& f = *pf++;

      if (pf != pf_end)
        return E_FILE_FORMAT_INVALID;

      f.pos = 0;  // patch later

      const long long total_size = stop - pos;

      if (total_size < size)
        return E_FILE_FORMAT_INVALID;

      const long long frame_size = total_size - size;

      if (frame_size > LONG_MAX || frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      f.len = static_cast<long>(frame_size);
    }

    pf = m_frames;
    while (pf != pf_end) {
      Frame& f = *pf++;
      assert((pos + f.len) <= stop);

      if ((pos + f.len) > stop)
        return E_FILE_FORMAT_INVALID;

      f.pos = pos;
      pos += f.len;
    }

    assert(pos == stop);
    if (pos != stop)
      return E_FILE_FORMAT_INVALID;

  } else if (lacing == 2) {  // fixed-size lacing
    if (pos >= stop)
      return E_FILE_FORMAT_INVALID;

    const long long total_size = stop - pos;

    if ((total_size % m_frame_count) != 0)
      return E_FILE_FORMAT_INVALID;

    const long long frame_size = total_size / m_frame_count;

    if (frame_size > LONG_MAX || frame_size <= 0)
      return E_FILE_FORMAT_INVALID;

    Frame* pf = m_frames;
    Frame* const pf_end = pf + m_frame_count;

    while (pf != pf_end) {
      assert((pos + frame_size) <= stop);
      if ((pos + frame_size) > stop)
        return E_FILE_FORMAT_INVALID;

      Frame& f = *pf++;

      f.pos = pos;
      f.len = static_cast<long>(frame_size);

      pos += frame_size;
    }

    assert(pos == stop);
    if (pos != stop)
      return E_FILE_FORMAT_INVALID;

  } else {
    assert(lacing == 3);  // EBML lacing

    if (pos >= stop)
      return E_FILE_FORMAT_INVALID;

    long long size = 0;
    int frame_count = m_frame_count;

    long long frame_size = ReadUInt(pReader, pos, len);

    if (frame_size <= 0)
      return E_FILE_FORMAT_INVALID;

    if (frame_size > LONG_MAX)
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > stop)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume length of size of first frame

    if ((pos + frame_size) > stop)
      return E_FILE_FORMAT_INVALID;

    Frame* pf = m_frames;
    Frame* const pf_end = pf + m_frame_count;

    {
      Frame& curr = *pf;

      curr.pos = 0;  // patch later

      curr.len = static_cast<long>(frame_size);
      size += curr.len;  // contribution of this frame
    }

    --frame_count;

    while (frame_count > 1) {
      if (pos >= stop)
        return E_FILE_FORMAT_INVALID;

      assert(pf < pf_end);
      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      const Frame& prev = *pf++;
      assert(prev.len == frame_size);
      if (prev.len != frame_size)
        return E_FILE_FORMAT_INVALID;

      assert(pf < pf_end);
      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      Frame& curr = *pf;

      curr.pos = 0;  // patch later

      const long long delta_size_ = ReadUInt(pReader, pos, len);

      if (delta_size_ < 0)
        return E_FILE_FORMAT_INVALID;

      if ((pos + len) > stop)
        return E_FILE_FORMAT_INVALID;

      pos += len;  // consume length of (delta) size
      if (pos > stop)
        return E_FILE_FORMAT_INVALID;

      const long exp = 7 * len - 1;
      const long long bias = (1LL << exp) - 1LL;
      const long long delta_size = delta_size_ - bias;

      frame_size += delta_size;

      if (frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      if (frame_size > LONG_MAX)
        return E_FILE_FORMAT_INVALID;

      curr.len = static_cast<long>(frame_size);
      // Check if size + curr.len could overflow.
      if (size > LLONG_MAX - curr.len) {
        return E_FILE_FORMAT_INVALID;
      }
      size += curr.len;  // contribution of this frame

      --frame_count;
    }

    // parse last frame
    if (frame_count > 0) {
      if (pos > stop || pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      const Frame& prev = *pf++;
      assert(prev.len == frame_size);
      if (prev.len != frame_size)
        return E_FILE_FORMAT_INVALID;

      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      Frame& curr = *pf++;
      if (pf != pf_end)
        return E_FILE_FORMAT_INVALID;

      curr.pos = 0;  // patch later

      const long long total_size = stop - pos;

      if (total_size < size)
        return E_FILE_FORMAT_INVALID;

      frame_size = total_size - size;

      if (frame_size > LONG_MAX || frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      curr.len = static_cast<long>(frame_size);
    }

    pf = m_frames;
    while (pf != pf_end) {
      Frame& f = *pf++;
      if ((pos + f.len) > stop)
        return E_FILE_FORMAT_INVALID;

      f.pos = pos;
      pos += f.len;
    }

    if (pos != stop)
      return E_FILE_FORMAT_INVALID;
  }

  return 0;  // success
}